

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

int mg_value_equal(mg_value *lhs,mg_value *rhs)

{
  uint uVar1;
  mg_string *pmVar2;
  mg_string *pmVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar5 = 0;
  if (lhs->type != rhs->type) {
    return 0;
  }
  switch(lhs->type) {
  case MG_VALUE_TYPE_NULL:
    uVar5 = 1;
    break;
  case MG_VALUE_TYPE_BOOL:
    uVar5 = (uint)(((rhs->field_1).bool_v != 0) != ((lhs->field_1).bool_v == 0));
    break;
  case MG_VALUE_TYPE_INTEGER:
  case MG_VALUE_TYPE_FLOAT:
    bVar8 = (lhs->field_1).integer_v == (rhs->field_1).integer_v;
    goto LAB_0010a4d2;
  case MG_VALUE_TYPE_STRING:
    iVar6 = mg_string_equal((lhs->field_1).string_v,(rhs->field_1).string_v);
    return iVar6;
  case MG_VALUE_TYPE_LIST:
    pmVar2 = (lhs->field_1).string_v;
    uVar1 = pmVar2->size;
    pmVar3 = (rhs->field_1).string_v;
    if (uVar1 == pmVar3->size) {
      uVar4 = 0;
      do {
        uVar7 = uVar4;
        if (uVar1 == uVar7) break;
        iVar6 = mg_value_equal(*(mg_value **)(pmVar2->data + uVar7 * 8),
                               *(mg_value **)(pmVar3->data + uVar7 * 8));
        uVar4 = uVar7 + 1;
      } while (iVar6 != 0);
      uVar5 = (uint)(uVar1 <= uVar7);
    }
    break;
  case MG_VALUE_TYPE_MAP:
    iVar6 = mg_map_equal((lhs->field_1).map_v,(rhs->field_1).map_v);
    return iVar6;
  case MG_VALUE_TYPE_NODE:
    iVar6 = mg_node_equal((lhs->field_1).node_v,(rhs->field_1).node_v);
    return iVar6;
  case MG_VALUE_TYPE_RELATIONSHIP:
    iVar6 = mg_relationship_equal((lhs->field_1).relationship_v,(rhs->field_1).relationship_v);
    return iVar6;
  case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
    iVar6 = mg_unbound_relationship_equal
                      ((lhs->field_1).unbound_relationship_v,(rhs->field_1).unbound_relationship_v);
    return iVar6;
  case MG_VALUE_TYPE_PATH:
    iVar6 = mg_path_equal((lhs->field_1).path_v,(rhs->field_1).path_v);
    return iVar6;
  case MG_VALUE_TYPE_DATE:
  case MG_VALUE_TYPE_LOCAL_TIME:
    bVar8 = ((lhs->field_1).node_v)->id == ((rhs->field_1).node_v)->id;
    goto LAB_0010a4d2;
  case MG_VALUE_TYPE_TIME:
  case MG_VALUE_TYPE_LOCAL_DATE_TIME:
    if (((lhs->field_1).relationship_v)->id != ((rhs->field_1).relationship_v)->id) {
      return 0;
    }
    bVar8 = ((lhs->field_1).relationship_v)->start_id == ((rhs->field_1).relationship_v)->start_id;
LAB_0010a4d2:
    uVar5 = (uint)bVar8;
    break;
  case MG_VALUE_TYPE_DATE_TIME:
    iVar6 = mg_date_time_equal((lhs->field_1).date_time_v,(rhs->field_1).date_time_v);
    return iVar6;
  case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
    iVar6 = mg_date_time_zone_id_equal
                      ((lhs->field_1).date_time_zone_id_v,(rhs->field_1).date_time_zone_id_v);
    return iVar6;
  case MG_VALUE_TYPE_DURATION:
    iVar6 = mg_duration_equal((lhs->field_1).duration_v,(rhs->field_1).duration_v);
    return iVar6;
  case MG_VALUE_TYPE_POINT_2D:
    iVar6 = mg_point_2d_equal((lhs->field_1).point_2d_v,(rhs->field_1).point_2d_v);
    return iVar6;
  case MG_VALUE_TYPE_POINT_3D:
    iVar6 = mg_point_3d_equal((lhs->field_1).point_3d_v,(rhs->field_1).point_3d_v);
    return iVar6;
  }
  return uVar5;
}

Assistant:

int mg_value_equal(const mg_value *lhs, const mg_value *rhs) {
  if (lhs->type != rhs->type) {
    return 0;
  }
  switch (lhs->type) {
    case MG_VALUE_TYPE_NULL:
      return 1;

    case MG_VALUE_TYPE_BOOL:
      return (lhs->bool_v == 0) == (rhs->bool_v == 0);

    case MG_VALUE_TYPE_INTEGER:
      return lhs->integer_v == rhs->integer_v;

    case MG_VALUE_TYPE_FLOAT:
      return lhs->integer_v == rhs->integer_v;

    case MG_VALUE_TYPE_STRING:
      return mg_string_equal(lhs->string_v, rhs->string_v);
    case MG_VALUE_TYPE_LIST:
      if (lhs->list_v->size != rhs->list_v->size) {
        return 0;
      }
      for (uint32_t i = 0; i < lhs->list_v->size; ++i) {
        if (!mg_value_equal(lhs->list_v->elements[i], rhs->list_v->elements[i]))
          return 0;
      }
      return 1;
    case MG_VALUE_TYPE_MAP:
      return mg_map_equal(lhs->map_v, rhs->map_v);
    case MG_VALUE_TYPE_NODE:
      return mg_node_equal(lhs->node_v, rhs->node_v);
    case MG_VALUE_TYPE_RELATIONSHIP:
      return mg_relationship_equal(lhs->relationship_v, rhs->relationship_v);
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      return mg_unbound_relationship_equal(lhs->unbound_relationship_v,
                                           rhs->unbound_relationship_v);
    case MG_VALUE_TYPE_PATH:
      return mg_path_equal(lhs->path_v, rhs->path_v);
    case MG_VALUE_TYPE_DATE:
      return mg_date_equal(lhs->date_v, rhs->date_v);
    case MG_VALUE_TYPE_TIME:
      return mg_time_equal(lhs->time_v, rhs->time_v);
    case MG_VALUE_TYPE_LOCAL_TIME:
      return mg_local_time_equal(lhs->local_time_v, rhs->local_time_v);
    case MG_VALUE_TYPE_DATE_TIME:
      return mg_date_time_equal(lhs->date_time_v, rhs->date_time_v);
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      return mg_date_time_zone_id_equal(lhs->date_time_zone_id_v,
                                        rhs->date_time_zone_id_v);
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      return mg_local_date_time_equal(lhs->local_date_time_v,
                                      rhs->local_date_time_v);
    case MG_VALUE_TYPE_DURATION:
      return mg_duration_equal(lhs->duration_v, rhs->duration_v);
    case MG_VALUE_TYPE_POINT_2D:
      return mg_point_2d_equal(lhs->point_2d_v, rhs->point_2d_v);
    case MG_VALUE_TYPE_POINT_3D:
      return mg_point_3d_equal(lhs->point_3d_v, rhs->point_3d_v);
    case MG_VALUE_TYPE_UNKNOWN:
      return 0;
  }
  return 0;
}